

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::msgpack::basic_msgpack_cursor<jsoncons::bytes_source,std::allocator<char>>::
reset<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
          (basic_msgpack_cursor<jsoncons::bytes_source,std::allocator<char>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source)

{
  pointer puVar1;
  pointer puVar2;
  char cVar3;
  uint6 uStack_26;
  
  puVar1 = (source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)(this + 0x20) = puVar1;
  *(pointer *)(this + 0x28) = puVar1;
  *(pointer *)(this + 0x30) = puVar2;
  basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset
            ((basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_> *)(this + 8));
  *(undefined2 *)(this + 0xa8) = 3;
  *(ulong *)(this + 0xaa) = (ulong)uStack_26;
  *(undefined8 *)(this + 0xb2) = 0;
  *(undefined8 *)(this + 0xb8) = 0;
  *(undefined8 *)(this + 0xc0) = 0;
  *(undefined4 *)(this + 200) = 0;
  *(undefined4 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  *(undefined8 *)(this + 0xe8) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0xf8) = 0;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::reset
            ((basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *)(this + 0x100)
            );
  this[0x1d0] = (basic_msgpack_cursor<jsoncons::bytes_source,std::allocator<char>>)0x0;
  cVar3 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar3 != '\0') {
    return;
  }
  (**(code **)(*(long *)this + 0x38))(this);
  return;
}

Assistant:

void reset(Sourceable&& source)
    {
        parser_.reset(std::forward<Sourceable>(source));
        cursor_visitor_.reset();
        cursor_handler_adaptor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }